

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_opt_get_params(int np,ggml_tensor **ps,float *x)

{
  ggml_tensor *pgVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  
  if (0 < np) {
    uVar4 = 0;
    iVar3 = 0;
    do {
      pgVar1 = ps[uVar4];
      iVar2 = pgVar1->ne[1] * pgVar1->ne[0] * pgVar1->ne[2] * pgVar1->ne[3];
      if (0 < iVar2) {
        lVar5 = 0;
        do {
          fVar6 = ggml_get_f32_1d(ps[uVar4],(int)lVar5);
          x[iVar3 + lVar5] = fVar6;
          lVar5 = lVar5 + 1;
        } while (iVar2 != (int)lVar5);
        iVar3 = iVar3 + (int)lVar5;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)np);
  }
  return;
}

Assistant:

static void ggml_opt_get_params(int np, struct ggml_tensor * const ps[], float * x) {
    int i = 0;
    for (int p = 0; p < np; ++p) {
        const int ne = ggml_nelements(ps[p]) ;
        // TODO: add function to get all elements at once
        for (int j = 0; j < ne; ++j) {
            x[i++] = ggml_get_f32_1d(ps[p], j);
        }
    }
}